

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall
irr::core::string<unsigned_long>::append(string<unsigned_long> *this,string<unsigned_long> *other)

{
  s32 sVar1;
  unsigned_long *puVar2;
  int local_20;
  s32 l;
  s32 len;
  string<unsigned_long> *other_local;
  string<unsigned_long> *this_local;
  
  this->used = this->used + -1;
  sVar1 = size(other);
  if (this->allocated < this->used + sVar1 + 1) {
    reallocate(this,this->used + sVar1 + 1);
  }
  for (local_20 = 0; local_20 < sVar1 + 1; local_20 = local_20 + 1) {
    puVar2 = operator[](other,local_20);
    this->array[local_20 + this->used] = *puVar2;
  }
  this->used = this->used + sVar1 + 1;
  return;
}

Assistant:

void append(const string<T>& other)
	{
		--used;

		s32 len = other.size();
		
		if (used + len + 1 > allocated)
			reallocate((s32)used + (s32)len + 1);

		for (s32 l=0; l<len+1; ++l)
			array[l+used] = other[l];

		used = used + len + 1;
	}